

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono_time_traits.hpp
# Opt level: O0

duration_type
asio::detail::
chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
::subtract(time_type *t1,time_type *t2)

{
  bool bVar1;
  strong_ordering sVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  __lhs;
  type __rhs;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RSI;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  time_type epoch;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff58;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff60;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff68;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff70;
  __unspec local_81;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff80;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff88;
  __unspec local_53;
  type local_52;
  __unspec local_51;
  rep local_50;
  duration local_48;
  rep local_40;
  type local_31;
  duration local_30;
  __unspec local_24;
  type local_23;
  __unspec local_22;
  type local_21;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_18;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_10;
  rep local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_ffffffffffffff60);
  local_21 = (type)std::chrono::
                   operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::__cmp_cat::__unspec::__unspec(&local_22,(__unspec *)0x0);
  bVar1 = std::operator>=(local_21);
  if (bVar1) {
    local_23 = (type)std::chrono::
                     operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cmp_cat::__unspec::__unspec(&local_24,(__unspec *)0x0);
    bVar1 = std::operator>=(local_23);
    if (bVar1) {
      local_8 = (rep)std::chrono::operator-(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    }
    else {
      local_30.__r = (rep)std::chrono::
                          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          ::min();
      bVar1 = std::chrono::operator==(in_stack_ffffffffffffff70,local_18);
      if (bVar1) {
        local_8 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::max();
      }
      else {
        local_48.__r = (rep)std::chrono::
                            time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            ::max();
        local_40 = (rep)std::chrono::operator-(local_18,in_stack_ffffffffffffff60);
        local_50 = (rep)std::chrono::operator-(local_18,in_stack_ffffffffffffff60);
        local_31 = (type)std::chrono::
                         operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000000000L>_>
                                   (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        std::__cmp_cat::__unspec::__unspec(&local_51,(__unspec *)0x0);
        bVar1 = std::operator<(local_31);
        if (bVar1) {
          local_8 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::max();
        }
        else {
          local_8 = (rep)std::chrono::operator-(local_18,in_stack_ffffffffffffff60);
        }
      }
    }
  }
  else {
    local_52 = (type)std::chrono::
                     operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cmp_cat::__unspec::__unspec(&local_53,(__unspec *)0x0);
    bVar1 = std::operator<(local_52);
    if (bVar1) {
      local_8 = (rep)std::chrono::operator-(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::min();
      bVar1 = std::chrono::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (bVar1) {
        local_8 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::min();
      }
      else {
        __lhs = std::chrono::
                time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                ::max();
        std::chrono::operator-(in_stack_ffffffffffffff68,local_10);
        __rhs = std::chrono::operator-(in_stack_ffffffffffffff68,local_10);
        sVar2 = std::chrono::
                operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000000000L>_>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)__lhs.__d.__r,
                           (duration<long,_std::ratio<1L,_1000000000L>_> *)__rhs.__r);
        std::__cmp_cat::__unspec::__unspec(&local_81,(__unspec *)0x0);
        bVar1 = std::operator<(sVar2._M_value);
        if (bVar1) {
          local_8 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::min();
        }
        else {
          std::chrono::operator-(in_stack_ffffffffffffff68,local_10);
          local_8 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-
                                   (in_stack_ffffffffffffff58);
        }
      }
    }
  }
  return (duration_type)local_8;
}

Assistant:

static duration_type subtract(const time_type& t1, const time_type& t2)
  {
    const time_type epoch;
    if (t1 >= epoch)
    {
      if (t2 >= epoch)
      {
        return t1 - t2;
      }
      else if (t2 == (time_type::min)())
      {
        return (duration_type::max)();
      }
      else if ((time_type::max)() - t1 < epoch - t2)
      {
        return (duration_type::max)();
      }
      else
      {
        return t1 - t2;
      }
    }
    else // t1 < epoch
    {
      if (t2 < epoch)
      {
        return t1 - t2;
      }
      else if (t1 == (time_type::min)())
      {
        return (duration_type::min)();
      }
      else if ((time_type::max)() - t2 < epoch - t1)
      {
        return (duration_type::min)();
      }
      else
      {
        return -(t2 - t1);
      }
    }
  }